

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O3

void __thiscall CTestNet4Params::CTestNet4Params(CTestNet4Params *this)

{
  uint256 *puVar1;
  CBlock *this_00;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  undefined8 uVar3;
  uint uVar4;
  pointer puVar5;
  pointer puVar6;
  pointer pAVar7;
  pointer pAVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  base_blob<256U> *pbVar11;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_02;
  pointer puVar12;
  long lVar13;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar14;
  undefined8 *puVar15;
  CBlock *pCVar16;
  long in_FS_OFFSET;
  byte bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  initializer_list<std::pair<const_int,_uint256>_> __l;
  CAmount *in_stack_ffffffffffffff00;
  allocator_type local_f1;
  undefined8 local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  uchar local_c8 [16];
  undefined1 local_b8 [9];
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  undefined1 uStack_ac;
  undefined1 uStack_ab;
  undefined1 uStack_aa;
  undefined1 uStack_a9;
  undefined1 local_a8 [9];
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined4 uStack_9c;
  _Base_ptr local_98;
  size_t local_90;
  undefined1 local_68 [16];
  pointer local_58;
  bool local_50;
  bool bStack_4f;
  bool local_4e;
  direct_or_indirect local_40;
  uint local_24;
  long local_20;
  
  bVar17 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(&this->super_CChainParams);
  (this->super_CChainParams).m_chain_type = TESTNET4;
  (this->super_CChainParams).consensus.signet_blocks = false;
  puVar5 = (this->super_CChainParams).consensus.signet_challenge.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).consensus.signet_challenge.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    (this->super_CChainParams).consensus.signet_challenge.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  (this->super_CChainParams).consensus.nSubsidyHalvingInterval = 210000;
  (this->super_CChainParams).consensus.BIP34Height = 1;
  puVar1 = &(this->super_CChainParams).consensus.BIP34Hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[8] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[9] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[10] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xb] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xc] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xd] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xe] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xf] = '\0';
  pbVar11 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x10] = '\0';
  (pbVar11->m_data)._M_elems[0x11] = '\0';
  (pbVar11->m_data)._M_elems[0x12] = '\0';
  (pbVar11->m_data)._M_elems[0x13] = '\0';
  (pbVar11->m_data)._M_elems[0x14] = '\0';
  (pbVar11->m_data)._M_elems[0x15] = '\0';
  (pbVar11->m_data)._M_elems[0x16] = '\0';
  (pbVar11->m_data)._M_elems[0x17] = '\0';
  (pbVar11->m_data)._M_elems[0x18] = '\0';
  (pbVar11->m_data)._M_elems[0x19] = '\0';
  (pbVar11->m_data)._M_elems[0x1a] = '\0';
  (pbVar11->m_data)._M_elems[0x1b] = '\0';
  (pbVar11->m_data)._M_elems[0x1c] = '\0';
  (pbVar11->m_data)._M_elems[0x1d] = '\0';
  (pbVar11->m_data)._M_elems[0x1e] = '\0';
  (pbVar11->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.BIP65Height = 1;
  (this->super_CChainParams).consensus.BIP66Height = 1;
  (this->super_CChainParams).consensus.CSVHeight = 1;
  (this->super_CChainParams).consensus.SegwitHeight = 1;
  (this->super_CChainParams).consensus.MinBIP9WarningHeight = 0;
  puVar1 = &(this->super_CChainParams).consensus.powLimit;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xff;
  pbVar11 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[4] = 0xff;
  (pbVar11->m_data)._M_elems[5] = 0xff;
  (pbVar11->m_data)._M_elems[6] = 0xff;
  (pbVar11->m_data)._M_elems[7] = 0xff;
  pbVar11 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[8] = 0xff;
  (pbVar11->m_data)._M_elems[9] = 0xff;
  (pbVar11->m_data)._M_elems[10] = 0xff;
  (pbVar11->m_data)._M_elems[0xb] = 0xff;
  pbVar11 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0xc] = 0xff;
  (pbVar11->m_data)._M_elems[0xd] = 0xff;
  (pbVar11->m_data)._M_elems[0xe] = 0xff;
  (pbVar11->m_data)._M_elems[0xf] = 0xff;
  pbVar11 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0xc] = 0xff;
  (pbVar11->m_data)._M_elems[0xd] = 0xff;
  (pbVar11->m_data)._M_elems[0xe] = 0xff;
  (pbVar11->m_data)._M_elems[0xf] = 0xff;
  pbVar11 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x10] = 0xff;
  (pbVar11->m_data)._M_elems[0x11] = 0xff;
  (pbVar11->m_data)._M_elems[0x12] = 0xff;
  (pbVar11->m_data)._M_elems[0x13] = 0xff;
  pbVar11 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x14] = 0xff;
  (pbVar11->m_data)._M_elems[0x15] = 0xff;
  (pbVar11->m_data)._M_elems[0x16] = 0xff;
  (pbVar11->m_data)._M_elems[0x17] = 0xff;
  pbVar11 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x18] = 0xff;
  (pbVar11->m_data)._M_elems[0x19] = 0xff;
  (pbVar11->m_data)._M_elems[0x1a] = 0xff;
  (pbVar11->m_data)._M_elems[0x1b] = 0xff;
  pbVar11 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x1c] = '\0';
  (pbVar11->m_data)._M_elems[0x1d] = '\0';
  (pbVar11->m_data)._M_elems[0x1e] = '\0';
  (pbVar11->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.nPowTargetTimespan = 0x127500;
  (this->super_CChainParams).consensus.nPowTargetSpacing = 600;
  (this->super_CChainParams).consensus.fPowAllowMinDifficultyBlocks = true;
  (this->super_CChainParams).consensus.enforce_BIP94 = true;
  (this->super_CChainParams).consensus.fPowNoRetargeting = false;
  (this->super_CChainParams).consensus.nRuleChangeActivationThreshold = 0x5e8;
  (this->super_CChainParams).consensus.nMinerConfirmationWindow = 0x7e0;
  (this->super_CChainParams).consensus.vDeployments[0].bit = 0x1c;
  (this->super_CChainParams).consensus.vDeployments[0].nStartTime = -2;
  (this->super_CChainParams).consensus.vDeployments[0].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[0].min_activation_height = 0;
  (this->super_CChainParams).consensus.vDeployments[1].bit = 2;
  (this->super_CChainParams).consensus.vDeployments[1].nStartTime = -1;
  (this->super_CChainParams).consensus.vDeployments[1].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[1].min_activation_height = 0;
  puVar1 = &(this->super_CChainParams).consensus.nMinimumChainWork;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xba;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0xf3;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\x02';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 'b';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '.';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 0xd0;
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\x15';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = 0xaa;
  (this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>.m_data._M_elems[8] =
       '_';
  pbVar11 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x18] = '\0';
  (pbVar11->m_data)._M_elems[0x19] = '\0';
  (pbVar11->m_data)._M_elems[0x1a] = '\0';
  (pbVar11->m_data)._M_elems[0x1b] = '\0';
  (pbVar11->m_data)._M_elems[0x1c] = '\0';
  (pbVar11->m_data)._M_elems[0x1d] = '\0';
  (pbVar11->m_data)._M_elems[0x1e] = '\0';
  (pbVar11->m_data)._M_elems[0x1f] = '\0';
  pbVar11 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[9] = '\0';
  (pbVar11->m_data)._M_elems[10] = '\0';
  (pbVar11->m_data)._M_elems[0xb] = '\0';
  (pbVar11->m_data)._M_elems[0xc] = '\0';
  (pbVar11->m_data)._M_elems[0xd] = '\0';
  (pbVar11->m_data)._M_elems[0xe] = '\0';
  (pbVar11->m_data)._M_elems[0xf] = '\0';
  (pbVar11->m_data)._M_elems[0x10] = '\0';
  (pbVar11->m_data)._M_elems[0x11] = '\0';
  (pbVar11->m_data)._M_elems[0x12] = '\0';
  (pbVar11->m_data)._M_elems[0x13] = '\0';
  (pbVar11->m_data)._M_elems[0x14] = '\0';
  (pbVar11->m_data)._M_elems[0x15] = '\0';
  (pbVar11->m_data)._M_elems[0x16] = '\0';
  (pbVar11->m_data)._M_elems[0x17] = '\0';
  (pbVar11->m_data)._M_elems[0x18] = '\0';
  puVar1 = &(this->super_CChainParams).consensus.defaultAssumeValid;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xfd;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0x81;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xf6;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xb6;
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 't';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 0xb3;
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = 0x8d;
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\x1a';
  pbVar11 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[8] = '9';
  (pbVar11->m_data)._M_elems[9] = '\x11';
  (pbVar11->m_data)._M_elems[10] = 0xb3;
  (pbVar11->m_data)._M_elems[0xb] = 0xcf;
  (pbVar11->m_data)._M_elems[0xc] = 'g';
  (pbVar11->m_data)._M_elems[0xd] = 0xb6;
  (pbVar11->m_data)._M_elems[0xe] = 0x95;
  (pbVar11->m_data)._M_elems[0xf] = 'F';
  pbVar11 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x10] = '|';
  (pbVar11->m_data)._M_elems[0x11] = 0xfe;
  (pbVar11->m_data)._M_elems[0x12] = 0x89;
  (pbVar11->m_data)._M_elems[0x13] = ']';
  (pbVar11->m_data)._M_elems[0x14] = 0xfa;
  (pbVar11->m_data)._M_elems[0x15] = 0x91;
  (pbVar11->m_data)._M_elems[0x16] = 0xb9;
  (pbVar11->m_data)._M_elems[0x17] = '}';
  pbVar11 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x18] = '\x05';
  (pbVar11->m_data)._M_elems[0x19] = 'H';
  (pbVar11->m_data)._M_elems[0x1a] = 0xe3;
  (pbVar11->m_data)._M_elems[0x1b] = '[';
  pbVar11 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x1c] = '\0';
  (pbVar11->m_data)._M_elems[0x1d] = '\0';
  (pbVar11->m_data)._M_elems[0x1e] = '\0';
  (pbVar11->m_data)._M_elems[0x1f] = '\0';
  *(undefined4 *)(this->super_CChainParams).pchMessageStart._M_elems = 0x283f161c;
  (this->super_CChainParams).nDefaultPort = 0xbccd;
  (this->super_CChainParams).nPruneAfterHeight = 1000;
  (this->super_CChainParams).m_assumed_blockchain_size = 1;
  (this->super_CChainParams).m_assumed_chain_state_size = 0;
  _local_a8 = (undefined1  [16])0x0;
  _local_b8 = (undefined1  [16])0x0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_e8,
             util::hex_literals::detail::Hex<67ul>__,(uchar *)"*seckeylen >= CKey::SIZE",
             (allocator_type *)&local_f0);
  this_02 = &CScript::operator<<((CScript *)local_b8,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8)
             ->super_CScriptBase;
  uVar4 = this_02->_size;
  uVar9 = uVar4 - 0x1d;
  if (uVar4 < 0x1d) {
    uVar9 = uVar4;
  }
  ppVar14 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (this_02->_union).indirect_contents.indirect;
  if (uVar4 < 0x1d) {
    ppVar14 = this_02;
  }
  local_f0 = CONCAT71(local_f0._1_7_,0xac);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_02,(uchar *)((long)&ppVar14->_union + (long)(int)uVar9),(uchar *)&local_f0);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_40.indirect_contents,this_02
            );
  if ((pointer)local_e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e8._0_8_,local_d8._0_8_ - local_e8._0_8_);
  }
  if (0x1c < uStack_9c) {
    free((void *)local_b8._0_8_);
  }
  local_f0 = 5000000000;
  CreateGenesisBlock((CBlock *)local_b8,
                     "03/May/2024 000000000000000000001ebd58c244970b3aa9d783bb001011fbe8ea8e98e00e",
                     (CScript *)&local_40.indirect_contents,0x66356f04,0x17780cbb,0x1d00ffff,
                     (int32_t)&local_f0,in_stack_ffffffffffffff00);
  this_00 = &(this->super_CChainParams).genesis;
  puVar15 = (undefined8 *)local_b8;
  pCVar16 = this_00;
  for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
    uVar3 = *puVar15;
    (pCVar16->super_CBlockHeader).nVersion = (int)uVar3;
    (pCVar16->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
         (char)((ulong)uVar3 >> 0x20);
    (pCVar16->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
         (char)((ulong)uVar3 >> 0x28);
    (pCVar16->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
         (char)((ulong)uVar3 >> 0x30);
    (pCVar16->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
         (char)((ulong)uVar3 >> 0x38);
    puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
    pCVar16 = (CBlock *)((long)pCVar16 + (ulong)bVar17 * -0x10 + 8);
  }
  local_d8._0_8_ =
       (this->super_CChainParams).genesis.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_58;
  pvVar2 = &(this->super_CChainParams).genesis.vtx;
  local_e8._0_8_ =
       (pvVar2->
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_e8._8_8_ =
       (pvVar2->
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_68._0_8_;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_68._8_8_;
  local_68 = (undefined1  [16])0x0;
  local_58 = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_e8);
  (this->super_CChainParams).genesis.m_checked_merkle_root = local_4e;
  (this->super_CChainParams).genesis.fChecked = local_50;
  (this->super_CChainParams).genesis.m_checked_witness_commitment = bStack_4f;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_68);
  CBlockHeader::GetHash((uint256 *)local_b8,&this_00->super_CBlockHeader);
  *(undefined8 *)
   ((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems +
   0x10) = local_a8._0_8_;
  *(_Base_ptr *)
   ((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems +
   0x18) = stack0xffffffffffffff60;
  *(undefined8 *)
   (this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems =
       local_b8._0_8_;
  *(undefined8 *)
   ((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems + 8)
       = stack0xffffffffffffff50;
  local_b8[8] = 0x56;
  local_b8._0_8_ = 0x5be350b0da8bf043;
  uStack_af = 0x7c;
  uStack_ae = 0x86;
  uStack_ad = 0x4b;
  uStack_ac = 0x91;
  uStack_ab = 0xf4;
  uStack_aa = 0x7f;
  uStack_a9 = 0x50;
  stack0xffffffffffffff60 = (_Base_ptr)0xda84f2ba;
  local_a8._0_8_ = 0xfbbc53dee25a72ae;
  auVar19[0] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x10] == 0xae);
  auVar19[1] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x11] == 'r');
  auVar19[2] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x12] == 'Z');
  auVar19[3] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x13] == 0xe2);
  auVar19[4] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x14] == 0xde);
  auVar19[5] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x15] == 'S');
  auVar19[6] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x16] == 0xbc);
  auVar19[7] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x17] == 0xfb);
  auVar19[8] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x18] == 0xba);
  auVar19[9] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x19] == 0xf2);
  auVar19[10] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data
                  ._M_elems[0x1a] == 0x84);
  auVar19[0xb] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1b] == 0xda);
  auVar19[0xc] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1c] == '\0');
  auVar19[0xd] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1d] == '\0');
  auVar19[0xe] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1e] == '\0');
  auVar19[0xf] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1f] == '\0');
  auVar18[0] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0] == 'C');
  auVar18[1] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[1] == 0xf0);
  auVar18[2] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[2] == 0x8b);
  auVar18[3] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[3] == 0xda);
  auVar18[4] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[4] == 0xb0);
  auVar18[5] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[5] == 'P');
  auVar18[6] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[6] == 0xe3);
  auVar18[7] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[7] == '[');
  auVar18[8] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[8] == 'V');
  auVar18[9] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[9] == '|');
  auVar18[10] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data
                  ._M_elems[10] == 0x86);
  auVar18[0xb] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xb] == 'K');
  auVar18[0xc] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xc] == 0x91);
  auVar18[0xd] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xd] == 0xf4);
  auVar18[0xe] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xe] == '\x7f');
  auVar18[0xf] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xf] == 'P');
  auVar19 = auVar19 & auVar18;
  if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"00000000da84f2bafbbc53dee25a72ae507ff4914b867c565be350b0da8bf043\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x16d,"CTestNet4Params::CTestNet4Params()");
  }
  local_b8[8] = 0xdb;
  local_b8._0_8_ = 0x9102fe28912b7b4e;
  uStack_af = 6;
  uStack_ae = 0x93;
  uStack_ad = 0xaf;
  uStack_ac = 0x2a;
  uStack_ab = 0xe4;
  uStack_aa = 0x18;
  uStack_a9 = 0xb7;
  local_a8[8] = 0x14;
  local_a8._0_8_ = 0xcb807e40cd57e667;
  uStack_9f = 0x34;
  uStack_9e = 0x22;
  uStack_9d = 0x1e;
  uStack_9c._0_1_ = 0xae;
  uStack_9c._1_1_ = 0xa7;
  uStack_9c._2_1_ = 0xa0;
  uStack_9c._3_1_ = 0x7a;
  auVar21[0] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) ==
                'g');
  auVar21[1] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x11) ==
                0xe6);
  auVar21[2] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x12) ==
                'W');
  auVar21[3] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x13) ==
                0xcd);
  auVar21[4] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x14) ==
                '@');
  auVar21[5] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x15) ==
                '~');
  auVar21[6] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x16) ==
                0x80);
  auVar21[7] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x17) ==
                0xcb);
  auVar21[8] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) ==
                '\x14');
  auVar21[9] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x19) ==
                '4');
  auVar21[10] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                   hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1a) ==
                 '\"');
  auVar21[0xb] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1b) ==
                  '\x1e');
  auVar21[0xc] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c) ==
                  0xae);
  auVar21[0xd] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1d) ==
                  0xa7);
  auVar21[0xe] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1e) ==
                  0xa0);
  auVar21[0xf] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1f) ==
                  'z');
  auVar20[0] = -((this->super_CChainParams).genesis.super_CBlockHeader.hashMerkleRoot.
                 super_base_blob<256U>.m_data._M_elems[0] == 'N');
  auVar20[1] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 1) == '{');
  auVar20[2] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 2) == '+');
  auVar20[3] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 3) == 0x91)
  ;
  auVar20[4] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 4) == '(');
  auVar20[5] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 5) == 0xfe)
  ;
  auVar20[6] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 6) ==
                '\x02');
  auVar20[7] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 7) == 0x91)
  ;
  auVar20[8] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) == 0xdb)
  ;
  auVar20[9] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 9) ==
                '\x06');
  auVar20[10] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                   hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 10) ==
                 0x93);
  auVar20[0xb] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xb) ==
                  0xaf);
  auVar20[0xc] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc) ==
                  '*');
  auVar20[0xd] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xd) ==
                  0xe4);
  auVar20[0xe] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xe) ==
                  '\x18');
  auVar20[0xf] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xf) ==
                  0xb7);
  auVar20 = auVar20 & auVar21;
  if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"7aa0a7ae1e223414cb807e40cd57e667b718e42aaf9306db9102fe28912b7b4e\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x16e,"CTestNet4Params::CTestNet4Params()");
  }
  puVar5 = (this->super_CChainParams).vFixedSeeds.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).vFixedSeeds.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    (this->super_CChainParams).vFixedSeeds.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  this_01 = &(this->super_CChainParams).vSeeds;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(this_01,(this->super_CChainParams).vSeeds.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[36]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [36])"seed.testnet4.bitcoin.sprovoost.nl.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[23]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [23])"seed.testnet4.wiz.biz.");
  puVar12 = (pointer)operator_new(1);
  *puVar12 = 'o';
  puVar5 = (this->super_CChainParams).base58Prefixes[0].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (this->super_CChainParams).base58Prefixes[0].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).base58Prefixes[0].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar12;
  (this->super_CChainParams).base58Prefixes[0].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar12 + 1;
  (this->super_CChainParams).base58Prefixes[0].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar12 + 1;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)puVar6 - (long)puVar5);
  }
  puVar12 = (pointer)operator_new(1);
  *puVar12 = 0xc4;
  puVar5 = (this->super_CChainParams).base58Prefixes[1].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (this->super_CChainParams).base58Prefixes[1].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).base58Prefixes[1].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar12;
  (this->super_CChainParams).base58Prefixes[1].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar12 + 1;
  (this->super_CChainParams).base58Prefixes[1].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar12 + 1;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)puVar6 - (long)puVar5);
  }
  puVar12 = (pointer)operator_new(1);
  *puVar12 = 0xef;
  puVar5 = (this->super_CChainParams).base58Prefixes[2].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (this->super_CChainParams).base58Prefixes[2].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).base58Prefixes[2].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar12;
  (this->super_CChainParams).base58Prefixes[2].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar12 + 1;
  (this->super_CChainParams).base58Prefixes[2].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar12 + 1;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)puVar6 - (long)puVar5);
  }
  local_b8._0_4_ = 0xcf873504;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 3),local_b8);
  local_b8._0_4_ = 0x94833504;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 4));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&(this->super_CChainParams).bech32_hrp,0,
             (this->super_CChainParams).bech32_hrp._M_string_length,"tb",2);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_b8,
             chainparams_seed_testnet4,"",(allocator_type *)local_e8);
  puVar5 = (this->super_CChainParams).vFixedSeeds.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (this->super_CChainParams).vFixedSeeds.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).vFixedSeeds.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_b8._0_8_;
  (this->super_CChainParams).vFixedSeeds.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)stack0xffffffffffffff50;
  (this->super_CChainParams).vFixedSeeds.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_a8._0_8_;
  _local_b8 = (undefined1  [16])0x0;
  local_a8._0_8_ = (pointer)0x0;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)puVar6 - (long)puVar5);
    if ((char *)local_b8._0_8_ != (char *)0x0) {
      operator_delete((void *)local_b8._0_8_,local_a8._0_8_ - local_b8._0_8_);
    }
  }
  (this->super_CChainParams).fDefaultConsistencyChecks = false;
  (this->super_CChainParams).m_is_mockable_chain = false;
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_c8[0] = '\0';
  local_c8[1] = '\0';
  local_c8[2] = '\0';
  local_c8[3] = '\0';
  __l._M_len = 1;
  __l._M_array = (iterator)local_e8;
  std::map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>::map
            ((map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *)
             local_b8,__l,(less<int> *)&local_f0,&local_f1);
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
           *)&(this->super_CChainParams).checkpointData);
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    (this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = stack0xffffffffffffff50;
    *(undefined8 *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 8) = local_a8._0_8_;
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x10) = stack0xffffffffffffff60;
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x18) = local_98;
    *(_Rb_tree_header **)(local_a8._0_8_ + 8) =
         &(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
          super__Rb_tree_header;
    (this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = local_90;
    local_a8._0_8_ = (pointer)0x0;
    local_90 = 0;
    local_98 = (_Base_ptr)(local_b8 + 8);
    unique0x10005082 = (_Base_ptr)(local_b8 + 8);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
               *)local_b8);
  std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>::vector
            ((vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *)local_b8,
             (initializer_list<AssumeutxoData>)ZEXT816(0),(allocator_type *)local_e8);
  pAVar7 = (this->super_CChainParams).m_assumeutxo_data.
           super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar8 = (this->super_CChainParams).m_assumeutxo_data.
           super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).m_assumeutxo_data.
  super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_b8._0_8_;
  (this->super_CChainParams).m_assumeutxo_data.
  super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)stack0xffffffffffffff50;
  (this->super_CChainParams).m_assumeutxo_data.
  super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_a8._0_8_;
  _local_b8 = (undefined1  [16])0x0;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = stack0xffffffffffffff60;
  _local_a8 = auVar10 << 0x40;
  if (pAVar7 != (pointer)0x0) {
    operator_delete(pAVar7,(long)pAVar8 - (long)pAVar7);
    if ((char *)local_b8._0_8_ != (char *)0x0) {
      operator_delete((void *)local_b8._0_8_,local_a8._0_8_ - local_b8._0_8_);
    }
  }
  (this->super_CChainParams).chainTxData.nTime = 0x66bcd676;
  (this->super_CChainParams).chainTxData.tx_count = 0xb8ded;
  (this->super_CChainParams).chainTxData.dTxRate = 0.01570402633472492;
  if (0x1c < local_24) {
    free(local_40.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTestNet4Params() {
        m_chain_type = ChainType::TESTNET4;
        consensus.signet_blocks = false;
        consensus.signet_challenge.clear();
        consensus.nSubsidyHalvingInterval = 210000;
        consensus.BIP34Height = 1;
        consensus.BIP34Hash = uint256{};
        consensus.BIP65Height = 1;
        consensus.BIP66Height = 1;
        consensus.CSVHeight = 1;
        consensus.SegwitHeight = 1;
        consensus.MinBIP9WarningHeight = 0;
        consensus.powLimit = uint256{"00000000ffffffffffffffffffffffffffffffffffffffffffffffffffffffff"};
        consensus.nPowTargetTimespan = 14 * 24 * 60 * 60; // two weeks
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = true;
        consensus.enforce_BIP94 = true;
        consensus.fPowNoRetargeting = false;
        consensus.nRuleChangeActivationThreshold = 1512; // 75% for testchains
        consensus.nMinerConfirmationWindow = 2016; // nPowTargetTimespan / nPowTargetSpacing
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = Consensus::BIP9Deployment::NEVER_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        // Deployment of Taproot (BIPs 340-342)
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = Consensus::BIP9Deployment::ALWAYS_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 0; // No activation delay

        consensus.nMinimumChainWork = uint256{"00000000000000000000000000000000000000000000005faa15d02e6202f3ba"};
        consensus.defaultAssumeValid = uint256{"000000005be348057db991fa5d89fe7c4695b667cfb311391a8db374b6f681fd"}; // 39550

        pchMessageStart[0] = 0x1c;
        pchMessageStart[1] = 0x16;
        pchMessageStart[2] = 0x3f;
        pchMessageStart[3] = 0x28;
        nDefaultPort = 48333;
        nPruneAfterHeight = 1000;
        m_assumed_blockchain_size = 1;
        m_assumed_chain_state_size = 0;

        const char* testnet4_genesis_msg = "03/May/2024 000000000000000000001ebd58c244970b3aa9d783bb001011fbe8ea8e98e00e";
        const CScript testnet4_genesis_script = CScript() << "000000000000000000000000000000000000000000000000000000000000000000"_hex_v_u8 << OP_CHECKSIG;
        genesis = CreateGenesisBlock(testnet4_genesis_msg,
                testnet4_genesis_script,
                1714777860,
                393743547,
                0x1d00ffff,
                1,
                50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"00000000da84f2bafbbc53dee25a72ae507ff4914b867c565be350b0da8bf043"});
        assert(genesis.hashMerkleRoot == uint256{"7aa0a7ae1e223414cb807e40cd57e667b718e42aaf9306db9102fe28912b7b4e"});

        vFixedSeeds.clear();
        vSeeds.clear();
        // nodes with support for servicebits filtering should be at the top
        vSeeds.emplace_back("seed.testnet4.bitcoin.sprovoost.nl."); // Sjors Provoost
        vSeeds.emplace_back("seed.testnet4.wiz.biz."); // Jason Maurice

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,111);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,196);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,239);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x35, 0x87, 0xCF};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x35, 0x83, 0x94};

        bech32_hrp = "tb";

        vFixedSeeds = std::vector<uint8_t>(std::begin(chainparams_seed_testnet4), std::end(chainparams_seed_testnet4));

        fDefaultConsistencyChecks = false;
        m_is_mockable_chain = false;

        checkpointData = {
            {
                {},
            }
        };

        m_assumeutxo_data = {
            {}
        };

        chainTxData = ChainTxData{
            // Data from RPC: getchaintxstats 4096 000000005be348057db991fa5d89fe7c4695b667cfb311391a8db374b6f681fd
            .nTime    = 1723651702,
            .tx_count = 757229,
            .dTxRate  = 0.01570402633472492,
        };
    }